

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesDriverGetExtensionProperties
          (zes_driver_handle_t hDriver,uint32_t *pCount,
          zes_driver_extension_properties_t *pExtensionProperties)

{
  zes_pfnDriverGetExtensionProperties_t pfnGetExtensionProperties;
  ze_result_t result;
  zes_driver_extension_properties_t *pExtensionProperties_local;
  uint32_t *pCount_local;
  zes_driver_handle_t hDriver_local;
  
  pfnGetExtensionProperties._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cb18 != (code *)0x0) {
    pfnGetExtensionProperties._4_4_ = (*DAT_0011cb18)(hDriver,pCount,pExtensionProperties);
  }
  return pfnGetExtensionProperties._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDriverGetExtensionProperties(
        zes_driver_handle_t hDriver,                    ///< [in] handle of the driver instance
        uint32_t* pCount,                               ///< [in,out] pointer to the number of extension properties.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of extension properties available.
                                                        ///< if count is greater than the number of extension properties available,
                                                        ///< then the driver shall update the value with the correct number of
                                                        ///< extension properties available.
        zes_driver_extension_properties_t* pExtensionProperties ///< [in,out][optional][range(0, *pCount)] array of query results for
                                                        ///< extension properties.
                                                        ///< if count is less than the number of extension properties available,
                                                        ///< then driver shall only retrieve that number of extension properties.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetExtensionProperties = context.zesDdiTable.Driver.pfnGetExtensionProperties;
        if( nullptr != pfnGetExtensionProperties )
        {
            result = pfnGetExtensionProperties( hDriver, pCount, pExtensionProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }